

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pline.c
# Opt level: O0

char * align_str(aligntyp alignment)

{
  char *pcStack_10;
  aligntyp alignment_local;
  
  if (alignment == -0x80) {
    pcStack_10 = "unaligned";
  }
  else if (alignment == -1) {
    pcStack_10 = "chaotic";
  }
  else if (alignment == '\0') {
    pcStack_10 = "neutral";
  }
  else if (alignment == '\x01') {
    pcStack_10 = "lawful";
  }
  else {
    pcStack_10 = "unknown";
  }
  return pcStack_10;
}

Assistant:

const char * align_str(aligntyp alignment)
{
    switch ((int)alignment) {
	case A_CHAOTIC: return "chaotic";
	case A_NEUTRAL: return "neutral";
	case A_LAWFUL:	return "lawful";
	case A_NONE:	return "unaligned";
    }
    return "unknown";
}